

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoxList.h
# Opt level: O1

Iterator __thiscall
axl::sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::insertTail
          (BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *this,Ptr<void> *value)

{
  size_t *psVar1;
  BoxIteratorImpl<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::rc::Ptr<void>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>
  BVar2;
  BoxListEntry<axl::rc::Ptr<void>_> *pBVar3;
  ListLink *link;
  
  BVar2.
  super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
  .m_p = (IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
          )operator_new(0x20);
  *(undefined8 *)
   ((long)BVar2.
          super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
          .m_p + 0x10) = 0;
  *(undefined8 *)
   ((long)BVar2.
          super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
          .m_p + 0x18) = 0;
  rc::Ptr<void>::copy((Ptr<void> *)
                      ((long)BVar2.
                             super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
                             .m_p + 0x10),(EVP_PKEY_CTX *)value->m_p,
                      (EVP_PKEY_CTX *)value->m_refCount);
  pBVar3 = (this->
           super_OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
           ).
           super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
           .super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_tail;
  *(undefined8 *)
   BVar2.
   super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
   .m_p = 0;
  *(BoxListEntry<axl::rc::Ptr<void>_> **)
   ((long)BVar2.
          super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
          .m_p + 8) = pBVar3;
  if (pBVar3 == (BoxListEntry<axl::rc::Ptr<void>_> *)0x0) {
    pBVar3 = (BoxListEntry<axl::rc::Ptr<void>_> *)this;
  }
  (((OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
     *)&pBVar3->super_ListLink)->
  super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
  ).super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_head =
       (BoxListEntry<axl::rc::Ptr<void>_> *)
       BVar2.
       super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
       .m_p;
  (this->
  super_OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
  ).
  super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
  .super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_tail =
       (BoxListEntry<axl::rc::Ptr<void>_> *)
       BVar2.
       super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
       .m_p;
  psVar1 = &(this->
            super_OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
            ).
            super_ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
            .super_ListData<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>.m_count;
  *psVar1 = *psVar1 + 1;
  return (Iterator)
         (Entry *)BVar2.
                  super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
                  .m_p;
}

Assistant:

Iterator
	insertTail(ValueArg value) {
		Entry* entry = new Entry;
		entry->m_value = value;
		return insertTailEntry(entry);
	}